

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

double __thiscall llvm::ErrorList::log(ErrorList *this,double __x)

{
  pointer puVar1;
  raw_ostream *in_RSI;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *ErrPayload;
  pointer puVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  
  raw_ostream::operator<<(in_RSI,"Multiple errors:\n");
  puVar1 = (this->Payloads).
           super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar3 = extraout_XMM0_Qa;
  for (puVar2 = (this->Payloads).
                super__Vector_base<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*((puVar2->_M_t).
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl)->_vptr_ErrorInfoBase[2])();
    raw_ostream::operator<<(in_RSI,"\n");
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

void log(raw_ostream &OS) const override {
    OS << "Multiple errors:\n";
    for (auto &ErrPayload : Payloads) {
      ErrPayload->log(OS);
      OS << "\n";
    }
  }